

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O2

bool __thiscall
EthBasePort::CheckFirewirePacket
          (EthBasePort *this,uchar *packet,size_t length,nodeid_t node,uint tcode,uint tl)

{
  ushort uVar1;
  ostream *poVar2;
  
  if ((*(uint *)packet >> 4 & 0xf) == tcode) {
    if ((node != 0x3f) && (uVar1 = *(ushort *)(packet + 6), (uVar1 & 0x3f) != node)) {
      poVar2 = std::operator<<((this->super_BasePort).outStr,"Inconsistent source node: received = "
                              );
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1 & 0x3f);
      poVar2 = std::operator<<(poVar2,", expected = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,node);
      goto LAB_00110fe7;
    }
    if ((*(uint *)packet >> 10 & 0x3f) == tl) {
      if (tcode != 7) {
        return true;
      }
      if (*(ushort *)(packet + 0xe) == length) {
        return true;
      }
      poVar2 = std::operator<<((this->super_BasePort).outStr,"Inconsistent length: received = ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2,", expected = ");
    }
    else {
      poVar2 = std::operator<<((this->super_BasePort).outStr,"Inconsistent Firewire TL: received = "
                              );
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2,", expected = ");
    }
  }
  else {
    poVar2 = std::operator<<((this->super_BasePort).outStr,"Unexpected tcode: received = ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,", expected = ");
  }
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
LAB_00110fe7:
  std::endl<char,std::char_traits<char>>(poVar2);
  return false;
}

Assistant:

bool EthBasePort::CheckFirewirePacket(const unsigned char *packet, size_t length, nodeid_t node, unsigned int tcode,
                                      unsigned int tl)
{
    if (!checkCRC(packet)) {
        outStr << "CheckFirewirePacket: CRC error" << std::endl;
        return false;
    }

    nodeid_t src_node;
    unsigned int tcode_recv;
    unsigned int tl_recv;
    GetFirewireHeaderInfo(packet, &src_node, &tcode_recv, &tl_recv);

    if (tcode_recv != tcode) {
        outStr << "Unexpected tcode: received = " << tcode_recv << ", expected = " << tcode << std::endl;
        return false;
    }
    if ((node != FW_NODE_BROADCAST) && (src_node != node)) {
        outStr << "Inconsistent source node: received = " << src_node << ", expected = " << node << std::endl;
        return false;
    }
    if (tl_recv != tl) {
        outStr << "Inconsistent Firewire TL: received = " << tl_recv
               << ", expected = " << tl << std::endl;
        return false;
    }
    // TODO: could also check QRESPONSE length
    if (tcode == BRESPONSE) {
        const quadlet_t *qpacket = reinterpret_cast<const quadlet_t *>(packet);
        size_t length_recv = (qpacket[3]&0xffff0000) >> 16;
        if (length_recv != length) {
            outStr << "Inconsistent length: received = " << length_recv << ", expected = " << length << std::endl;
            return false;
        }
    }
    return true;
}